

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp
# Opt level: O1

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  
  dVar1 = cos(*j);
  dVar2 = cos(j[3]);
  dVar3 = sin(*j);
  dVar4 = sin(j[3]);
  dVar5 = sin(j[4]);
  dVar6 = sin(j[1]);
  dVar7 = sin(j[2]);
  dVar8 = cos(j[1]);
  dVar9 = cos(j[2]);
  dVar10 = cos(j[4]);
  dVar11 = sin(j[5]);
  dVar12 = cos(j[5]);
  dVar13 = dVar6 * dVar7;
  dVar20 = dVar8 * dVar9;
  dVar9 = dVar6 * dVar9;
  dVar34 = dVar1 * dVar20 - dVar1 * dVar13;
  dVar23 = dVar1 * dVar13 - dVar1 * dVar20;
  dVar15 = dVar3 * dVar20 - dVar3 * dVar13;
  dVar38 = dVar3 * dVar13 - dVar3 * dVar20;
  dVar7 = dVar7 * dVar8;
  dVar31 = dVar7 + dVar9;
  dVar16 = dVar1 * dVar31;
  dVar29 = -dVar3 * dVar4 - dVar2 * dVar16;
  dVar14 = dVar4 * dVar16 - dVar3 * dVar2;
  dVar17 = dVar3 * dVar31;
  dVar36 = dVar1 * dVar4 - dVar2 * dVar17;
  dVar18 = dVar1 * dVar2 + dVar4 * dVar17;
  dVar32 = dVar5 * 3.9999999968e-05;
  dVar30 = dVar10 * 3.9999999968e-05;
  dVar24 = (dVar13 - dVar20) * dVar2;
  dVar27 = dVar5 * 0.9999999992;
  dVar25 = dVar10 * 0.9999999992;
  dVar21 = dVar25 * dVar24 + dVar27 * dVar31 + (dVar32 * dVar24 - dVar30 * dVar31);
  dVar22 = dVar25 * dVar29 + dVar32 * dVar29 + dVar27 * dVar23 + dVar30 * dVar34;
  dVar37 = dVar25 * dVar36 + dVar32 * dVar36 + dVar27 * dVar38 + dVar30 * dVar15;
  *eerot = dVar12 * dVar22 + dVar11 * dVar14;
  eerot[1] = dVar14 * dVar12 - dVar22 * dVar11;
  eerot[2] = dVar25 * dVar34 + ((dVar27 * dVar29 - dVar29 * dVar30) - dVar32 * dVar23);
  dVar22 = dVar5 * 0.134999999784;
  dVar28 = dVar1 * 0.175;
  dVar19 = dVar10 * -5.39999999136e-06;
  dVar33 = dVar10 * 0.134999999784;
  dVar26 = dVar1 * 2.159999996544e-10;
  dVar14 = dVar5 * -5.39999999136e-06;
  dVar35 = dVar1 * 5.39999999136e-06;
  *eetrans = (dVar35 * dVar13 - dVar20 * dVar35) * dVar5 +
             dVar23 * dVar14 +
             (dVar3 * dVar4 * -5.39999999136e-06 - dVar16 * dVar2 * 5.39999999136e-06) * dVar10 +
             (dVar26 * dVar20 - dVar13 * dVar26) * dVar10 +
             dVar1 * 1.271 * dVar20 +
             (dVar3 * dVar4 * -2.159999996544e-10 - dVar2 * 2.159999996544e-10 * dVar16) * dVar5 +
             dVar34 * dVar33 +
             dVar29 * dVar19 +
             dVar28 * dVar9 +
             dVar28 * dVar7 + ((dVar22 * dVar29 + dVar1 * dVar6 * 1.095) - dVar1 * 1.271 * dVar13) +
             dVar28;
  eerot[3] = dVar12 * dVar37 + dVar11 * dVar18;
  eerot[4] = dVar18 * dVar12 - dVar37 * dVar11;
  eerot[5] = dVar25 * dVar15 + ((dVar27 * dVar36 - dVar36 * dVar30) - dVar32 * dVar38);
  dVar1 = dVar3 * 0.175;
  dVar16 = (dVar20 - dVar13) * dVar4;
  eetrans[1] = (dVar35 * dVar4 - dVar17 * dVar2 * 5.39999999136e-06) * dVar10 +
               dVar38 * dVar14 +
               dVar6 * 1.095 * dVar3 +
               (dVar3 * 2.159999996544e-10 * dVar20 - dVar3 * 2.159999996544e-10 * dVar13) * dVar10
               + dVar1 * dVar7 +
                 dVar1 * dVar9 +
                 dVar15 * dVar33 +
                 (dVar3 * 5.39999999136e-06 * dVar13 - dVar20 * dVar3 * 5.39999999136e-06) * dVar5 +
                 dVar36 * dVar19 +
                 dVar3 * 1.271 * dVar20 +
                 (dVar26 * dVar4 - dVar2 * 2.159999996544e-10 * dVar17) * dVar5 +
                 (dVar22 * dVar36 - dVar3 * 1.271 * dVar13) + dVar1;
  eerot[6] = dVar11 * dVar16 + dVar12 * dVar21;
  eerot[7] = dVar16 * dVar12 - dVar21 * dVar11;
  eerot[8] = ((dVar27 * dVar24 - dVar32 * dVar31) - dVar25 * dVar31) - dVar30 * dVar24;
  eetrans[2] = dVar14 * dVar31 +
               (dVar7 * -2.159999996544e-10 + dVar9 * -2.159999996544e-10) * dVar10 +
               dVar24 * dVar22 +
               dVar8 * 1.095 +
               (dVar13 * 5.39999999136e-06 + dVar20 * -5.39999999136e-06) * dVar2 * dVar10 +
               (dVar20 * -2.159999996544e-10 + dVar13 * 2.159999996544e-10) * dVar2 * dVar5 +
               (dVar9 * 5.39999999136e-06 + dVar7 * 5.39999999136e-06) * dVar5 +
               dVar7 * -1.271 +
               dVar9 * -1.271 +
               ((dVar20 * 0.175 + dVar19 * dVar24 + dVar13 * -0.175 + 0.495) - dVar33 * dVar31);
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47,x48,x49,x50,x51,x52,x53,x54,x55,x56,x57,x58,x59,x60,x61,x62,x63,x64;
x0=IKcos(j[0]);
x1=IKcos(j[3]);
x2=IKsin(j[0]);
x3=IKsin(j[3]);
x4=IKsin(j[4]);
x5=IKsin(j[1]);
x6=IKsin(j[2]);
x7=IKcos(j[1]);
x8=IKcos(j[2]);
x9=IKcos(j[4]);
x10=IKsin(j[5]);
x11=IKcos(j[5]);
x12=((0.134999999784)*x4);
x13=((5.39999999136e-6)*x4);
x14=((0.9999999992)*x4);
x15=((1.271)*x0);
x16=((1.271)*x2);
x17=((5.39999999136e-6)*x0);
x18=((0.175)*x0);
x19=((3.9999999968e-5)*x4);
x20=((5.39999999136e-6)*x9);
x21=((0.175)*x2);
x22=((0.134999999784)*x9);
x23=((3.9999999968e-5)*x9);
x24=((0.9999999992)*x9);
x25=((1.0)*x2);
x26=((5.39999999136e-6)*x1);
x27=((1.095)*x5);
x28=((2.159999996544e-10)*x0);
x29=((1.0)*x0);
x30=((2.159999996544e-10)*x2);
x31=((2.159999996544e-10)*x1);
x32=((5.39999999136e-6)*x2);
x33=(x5*x6);
x34=(x7*x8);
x35=(x1*x9);
x36=(x2*x3);
x37=(x6*x7);
x38=(x5*x8);
x39=((1.0)*x34);
x40=(x29*x33);
x41=(x25*x33);
x42=((((-1.0)*x39))+x33);
x43=((((-1.0)*x33))+x39);
x44=((((1.0)*x38))+(((1.0)*x37)));
x45=((-1.0)*x44);
x46=(x1*x42);
x47=(x3*x43);
x48=((((-1.0)*x40))+((x0*x34)));
x49=((((-1.0)*x41))+((x2*x34)));
x50=((((-1.0)*x29*x34))+x40);
x51=((((-1.0)*x25*x34))+x41);
x52=(x29*((x38+x37)));
x53=((-1.0)*x52);
x54=(x25*((x38+x37)));
x55=((-1.0)*x54);
x56=(x1*x55);
x57=((((-1.0)*x25*x3))+((x1*x53)));
x58=(((x3*x52))+(((-1.0)*x1*x25)));
x59=(((x0*x3))+x56);
x60=(((x0*x1))+((x3*x54)));
x61=(x4*x57);
x62=(((x19*x46))+((x23*x45))+((x14*x44))+((x24*x46)));
x63=(((x14*x50))+((x23*x48))+((x19*x57))+((x24*x57)));
x64=(((x14*x51))+((x23*x49))+((x19*x59))+((x24*x59)));
eerot[0]=(((x11*x63))+((x10*x58)));
eerot[1]=((((-1.0)*x10*x63))+((x11*x58)));
eerot[2]=(((x14*x57))+(((-1.0)*x23*x57))+(((-1.0)*x19*x50))+((x24*x48)));
IkReal x65=((1.0)*x33);
eetrans[0]=(((x12*x57))+((x0*x27))+(((-1.0)*x15*x65))+((x18*x37))+((x18*x38))+(((-1.0)*x20*x57))+((x22*x48))+((x4*(((((-2.159999996544e-10)*x36))+((x31*x53))))))+((x15*x34))+((x9*((((x28*x34))+(((-1.0)*x28*x65))))))+x18+((x9*((((x26*x53))+(((-5.39999999136e-6)*x36))))))+(((-1.0)*x13*x50))+((x4*((((x17*x33))+(((-1.0)*x17*x34)))))));
eerot[3]=(((x11*x64))+((x10*x60)));
eerot[4]=((((-1.0)*x10*x64))+((x11*x60)));
eerot[5]=(((x14*x59))+(((-1.0)*x23*x59))+(((-1.0)*x19*x51))+((x24*x49)));
IkReal x66=((1.0)*x33);
eetrans[1]=((((-1.0)*x16*x66))+((x12*x59))+((x4*((((x31*x55))+((x28*x3))))))+((x16*x34))+(((-1.0)*x20*x59))+((x4*((((x32*x33))+(((-1.0)*x32*x34))))))+((x22*x49))+((x21*x38))+((x21*x37))+((x9*(((((-1.0)*x30*x66))+((x30*x34))))))+((x2*x27))+x21+(((-1.0)*x13*x51))+((x9*((((x26*x55))+((x17*x3)))))));
eerot[6]=(((x10*x47))+((x11*x62)));
eerot[7]=((((-1.0)*x10*x62))+((x11*x47)));
eerot[8]=(((x14*x46))+(((-1.0)*x19*x44))+((x24*x45))+(((-1.0)*x23*x46)));
eetrans[2]=((0.495)+(((-0.175)*x33))+(((-1.0)*x20*x46))+(((0.175)*x34))+((x22*x45))+(((-1.271)*x38))+(((-1.271)*x37))+((x4*(((((5.39999999136e-6)*x38))+(((5.39999999136e-6)*x37))))))+((x1*x4*(((((-2.159999996544e-10)*x34))+(((2.159999996544e-10)*x33))))))+((x35*(((((5.39999999136e-6)*x33))+(((-5.39999999136e-6)*x34))))))+(((1.095)*x7))+((x12*x46))+((x9*(((((-2.159999996544e-10)*x37))+(((-2.159999996544e-10)*x38))))))+(((-1.0)*x13*x44)));
}